

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.c
# Opt level: O3

void err_set_logfp(FILE *stream)

{
  logfp_disabled = stream == (FILE *)0x0;
  logfp = stream;
  return;
}

Assistant:

void
err_set_logfp(FILE *stream)
{
    if (stream == NULL) {
	logfp_disabled = TRUE;
	logfp = NULL;
	return;
    }    
    logfp_disabled = FALSE;
    logfp = stream;
    return;
}